

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_time(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_int64 in_RAX;
  time_t tt;
  jx9_int64 local_18;
  
  local_18 = in_RAX;
  time(&local_18);
  jx9_result_int64(pCtx,local_18);
  return 0;
}

Assistant:

static int jx9Builtin_time(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	time_t tt;
	SXUNUSED(nArg); /* cc warning */
	SXUNUSED(apArg);
	/* Extract the current time */
	time(&tt);
	/* Return as 64-bit integer */
	jx9_result_int64(pCtx, (jx9_int64)tt);
	return  JX9_OK;
}